

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall TTD::ThreadContextTTD::SyncRootsBeforeSnapshot_Record(ThreadContextTTD *this)

{
  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar1;
  BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  Type pSVar2;
  RecyclableObject *pRVar3;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar4;
  RecyclableObject *pRVar5;
  DictionaryStats *pDVar6;
  Type pSVar7;
  bool bVar8;
  uint uVar9;
  hash_t bucket;
  uint i;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_02;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int nextIndex;
  ulong uVar15;
  
  CleanRecordWeakRootMap(this);
  this_00 = &this->m_ttdRootTagToObjectMap;
  uVar9 = (this->m_ttdRootTagToObjectMap).bucketCount;
  if (uVar9 != 0) {
    uVar13 = 0;
    do {
      uVar11 = this_00->buckets[uVar13];
      if (uVar11 != 0xffffffff) {
        uVar9 = 0xffffffff;
        do {
          pSVar2 = (this->m_ttdRootTagToObjectMap).entries;
          this_02 = Memory::
                    RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
                    ::operator->(&this->m_ttdRecordRootWeakMap);
          if ((this_02->buckets).ptr != (int *)0x0) {
            pRVar3 = pSVar2[(int)uVar11].
                     super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                     super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                     .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value;
            uVar14 = (uint)((ulong)pRVar3 >> 3) | 1;
            bucket = PrimePolicy::ModPrime(uVar14,this_02->size,this_02->modFunctionIndex);
            if ((this_02->buckets).ptr != (int *)0x0) {
              Memory::Recycler::IsSweeping(this_02->recycler);
              i = (this_02->buckets).ptr[bucket];
              if (-1 < (int)i) {
                uVar15 = 0xffffffff;
                do {
                  uVar12 = (ulong)i;
                  pWVar4 = (this_02->entries).ptr;
                  if (pWVar4[uVar12].hash == uVar14) {
                    pRVar5 = (RecyclableObject *)
                             ((pWVar4[uVar12].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
                    if (pRVar5 != (RecyclableObject *)0x0) {
                      if (pRVar5 != pRVar3) goto LAB_008f3ed7;
                      if (pWVar4[uVar12].value != false) {
                        uVar9 = uVar11;
                        uVar11 = (this->m_ttdRootTagToObjectMap).entries[(int)uVar11].
                                 super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                                 super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                                 .
                                 super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>
                                 .next;
                        goto LAB_008f3fd0;
                      }
                      break;
                    }
                    i = JsUtil::
                        WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
                        ::RemoveEntry(this_02,i,(int)uVar15,bucket);
                  }
                  else {
LAB_008f3ed7:
                    i = pWVar4[uVar12].next;
                    uVar15 = uVar12;
                  }
                } while (-1 < (int)i);
              }
            }
          }
          pSVar2 = (this->m_ttdRootTagToObjectMap).entries;
          uVar14 = pSVar2[(int)uVar11].
                   super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
                   super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
                   .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next;
          if ((int)uVar9 < 0) {
            this_00->buckets[uVar13] = uVar14;
          }
          else {
            pSVar2[uVar9].
            super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
            super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.next = uVar14;
          }
          pSVar2[(int)uVar11].
          super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
          super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.value =
               (RecyclableObject *)0x0;
          pSVar2[(int)uVar11].
          super_DefaultHashedEntry<unsigned_long,_Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_long,_Js::RecyclableObject_*>.
          super_ValueEntry<Js::RecyclableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_long,_Js::RecyclableObject_*>.key = 0;
          JsUtil::
          BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::SetNextFreeEntryIndex
                    (this_00,(this->m_ttdRootTagToObjectMap).entries + (int)uVar11,
                     -(uint)((this->m_ttdRootTagToObjectMap).freeCount == 0) |
                     (this->m_ttdRootTagToObjectMap).freeList);
          (this->m_ttdRootTagToObjectMap).freeList = uVar11;
          pTVar1 = &(this->m_ttdRootTagToObjectMap).freeCount;
          *pTVar1 = *pTVar1 + 1;
          pDVar6 = (this->m_ttdRootTagToObjectMap).stats;
          uVar11 = uVar14;
          if (pDVar6 != (DictionaryStats *)0x0) {
            DictionaryStats::Remove(pDVar6,this_00->buckets[uVar13] == -1);
          }
LAB_008f3fd0:
        } while (uVar11 != 0xffffffff);
        uVar9 = (this->m_ttdRootTagToObjectMap).bucketCount;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar9);
  }
  uVar9 = (this->m_ttdMayBeLongLivedRoot).bucketCount;
  if (uVar9 != 0) {
    this_01 = &this->m_ttdMayBeLongLivedRoot;
    uVar13 = 0;
    do {
      if (this_01->buckets[uVar13] != 0xffffffff) {
        uVar15 = 0xffffffff;
        uVar9 = this_01->buckets[uVar13];
        do {
          uVar12 = (ulong)uVar9;
          bVar8 = JsUtil::
                  BaseDictionary<unsigned_long,_Js::RecyclableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::ContainsKey(this_00,&(this->m_ttdMayBeLongLivedRoot).entries[(int)uVar9].
                                         super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                         .super_KeyValueEntry<unsigned_long,_bool>.
                                         super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                                         .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key);
          pSVar7 = (this->m_ttdMayBeLongLivedRoot).entries;
          uVar11 = pSVar7[(int)uVar9].
                   super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_long,_bool>.
                   super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                   .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
          if (!bVar8) {
            piVar10 = &pSVar7[uVar15].
                       super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<unsigned_long,_bool>.
                       super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
                       .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.next;
            if ((int)uVar15 < 0) {
              piVar10 = (this->m_ttdMayBeLongLivedRoot).buckets + uVar13;
            }
            *piVar10 = uVar11;
            pSVar7[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.value = false;
            pSVar7[(int)uVar9].
            super_DefaultHashedEntry<unsigned_long,_bool,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_long,_bool>.
            super_ValueEntry<bool,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_long,_bool>_>
            .super_KeyValueEntryDataLayout2<unsigned_long,_bool>.key = 0;
            JsUtil::
            BaseDictionary<unsigned_long,_bool,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::SetNextFreeEntryIndex
                      (this_01,pSVar7 + (int)uVar9,
                       -(uint)((this->m_ttdMayBeLongLivedRoot).freeCount == 0) |
                       (this->m_ttdMayBeLongLivedRoot).freeList);
            (this->m_ttdMayBeLongLivedRoot).freeList = uVar9;
            pTVar1 = &(this->m_ttdMayBeLongLivedRoot).freeCount;
            *pTVar1 = *pTVar1 + 1;
            pDVar6 = (this->m_ttdMayBeLongLivedRoot).stats;
            uVar12 = uVar15;
            if (pDVar6 != (DictionaryStats *)0x0) {
              DictionaryStats::Remove(pDVar6,this_01->buckets[uVar13] == -1);
            }
          }
          uVar15 = uVar12;
          uVar9 = uVar11;
        } while (uVar11 != 0xffffffff);
        uVar9 = (this->m_ttdMayBeLongLivedRoot).bucketCount;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar9);
  }
  return;
}

Assistant:

void ThreadContextTTD::SyncRootsBeforeSnapshot_Record()
    {
        this->CleanRecordWeakRootMap();

        this->m_ttdRootTagToObjectMap.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, Js::RecyclableObject*>& entry) -> bool
        {
            return !this->m_ttdRecordRootWeakMap->Lookup(entry.Value(), false);
        });

        this->m_ttdMayBeLongLivedRoot.MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<TTD_LOG_PTR_ID, bool>& entry) -> bool
        {
            return !this->m_ttdRootTagToObjectMap.ContainsKey(entry.Key());
        });
    }